

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O1

void zdd_fprintdot(FILE *out,ZDD zdd)

{
  char *pcVar1;
  
  fwrite("digraph \"DD\" {\n",0xf,1,(FILE *)out);
  fwrite("graph [dpi = 300];\n",0x13,1,(FILE *)out);
  fwrite("center = true;\n",0xf,1,(FILE *)out);
  fwrite("edge [dir = forward];\n",0x16,1,(FILE *)out);
  fwrite("root [style=invis];\n",0x14,1,(FILE *)out);
  pcVar1 = "dot";
  if (-1 < (long)zdd) {
    pcVar1 = "none";
  }
  fprintf((FILE *)out,"root -> %lu [style=solid dir=both arrowtail=%s];\n",zdd & 0xffffffffff,pcVar1
         );
  zdd_fprintdot_rec(out,zdd);
  zdd_unmark_rec(zdd);
  fwrite("}\n",2,1,(FILE *)out);
  return;
}

Assistant:

void
zdd_fprintdot(FILE *out, ZDD zdd)
{
    fprintf(out, "digraph \"DD\" {\n");
    fprintf(out, "graph [dpi = 300];\n");
    fprintf(out, "center = true;\n");
    fprintf(out, "edge [dir = forward];\n");
    fprintf(out, "root [style=invis];\n");
    fprintf(out, "root -> %" PRIu64 " [style=solid dir=both arrowtail=%s];\n",
            ZDD_GETINDEX(zdd), ZDD_HASMARK(zdd) ? "dot" : "none");

    zdd_fprintdot_rec(out, zdd);
    zdd_unmark_rec(zdd);

    fprintf(out, "}\n");
}